

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_flm.cpp
# Opt level: O3

void __thiscall
phoenix_flm_t::flm_entry_t::flm_entry_t
          (flm_entry_t *this,kstream *p__io,phoenix_flm_t *p__parent,phoenix_flm_t *p__root)

{
  (this->super_kstruct).m__io = p__io;
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__flm_entry_t_001850d0;
  (this->m_guid)._M_dataplus._M_p = (pointer)&(this->m_guid).field_2;
  (this->m_guid)._M_string_length = 0;
  (this->m_guid).field_2._M_local_buf[0] = '\0';
  this->m__parent = p__parent;
  this->m__root = p__root;
  _read(this);
  return;
}

Assistant:

phoenix_flm_t::flm_entry_t::flm_entry_t(kaitai::kstream* p__io, phoenix_flm_t* p__parent, phoenix_flm_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = p__root;
    _read();
}